

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederate.cpp
# Opt level: O2

void __thiscall helics::ValueFederate::loadFederateData(ValueFederate *this)

{
  _func_int **pp_Var1;
  _func_int *p_Var2;
  __uniq_ptr_impl<helics::ValueFederateManager,_std::default_delete<helics::ValueFederateManager>_>
  __p;
  undefined4 local_2c;
  ValueFederate *local_28;
  ValueFederate *local_20;
  __uniq_ptr_impl<helics::ValueFederateManager,_std::default_delete<helics::ValueFederateManager>_>
  local_18;
  
  local_20 = *(ValueFederate **)(&this->field_0x18 + (long)this->_vptr_ValueFederate[-3]);
  local_2c = *(undefined4 *)(&this->field_0x10 + (long)this->_vptr_ValueFederate[-3]);
  local_28 = this;
  std::
  make_unique<helics::ValueFederateManager,helics::Core*,helics::ValueFederate*,helics::LocalFederateId,bool&>
            ((Core **)&local_18,&local_20,(LocalFederateId *)&local_28,(bool *)&local_2c);
  __p._M_t.
  super__Tuple_impl<0UL,_helics::ValueFederateManager_*,_std::default_delete<helics::ValueFederateManager>_>
  .super__Head_base<0UL,_helics::ValueFederateManager_*,_false>._M_head_impl =
       local_18._M_t.
       super__Tuple_impl<0UL,_helics::ValueFederateManager_*,_std::default_delete<helics::ValueFederateManager>_>
       .super__Head_base<0UL,_helics::ValueFederateManager_*,_false>._M_head_impl;
  local_18._M_t.
  super__Tuple_impl<0UL,_helics::ValueFederateManager_*,_std::default_delete<helics::ValueFederateManager>_>
  .super__Head_base<0UL,_helics::ValueFederateManager_*,_false>._M_head_impl =
       (tuple<helics::ValueFederateManager_*,_std::default_delete<helics::ValueFederateManager>_>)
       (_Tuple_impl<0UL,_helics::ValueFederateManager_*,_std::default_delete<helics::ValueFederateManager>_>
        )0x0;
  std::
  __uniq_ptr_impl<helics::ValueFederateManager,_std::default_delete<helics::ValueFederateManager>_>
  ::reset((__uniq_ptr_impl<helics::ValueFederateManager,_std::default_delete<helics::ValueFederateManager>_>
           *)&this->vfManager,
          (pointer)__p._M_t.
                   super__Tuple_impl<0UL,_helics::ValueFederateManager_*,_std::default_delete<helics::ValueFederateManager>_>
                   .super__Head_base<0UL,_helics::ValueFederateManager_*,_false>._M_head_impl);
  std::unique_ptr<helics::ValueFederateManager,_std::default_delete<helics::ValueFederateManager>_>
  ::~unique_ptr((unique_ptr<helics::ValueFederateManager,_std::default_delete<helics::ValueFederateManager>_>
                 *)&local_18);
  pp_Var1 = this->_vptr_ValueFederate;
  ((this->vfManager)._M_t.
   super___uniq_ptr_impl<helics::ValueFederateManager,_std::default_delete<helics::ValueFederateManager>_>
   ._M_t.
   super__Tuple_impl<0UL,_helics::ValueFederateManager_*,_std::default_delete<helics::ValueFederateManager>_>
   .super__Head_base<0UL,_helics::ValueFederateManager_*,_false>._M_head_impl)->useJsonSerialization
       = (bool)(pp_Var1[-3] + 3)[(long)&(this->vfManager)._M_t];
  p_Var2 = pp_Var1[-3];
  if (*(long *)(&this->field_0x40 + (long)p_Var2) != 0) {
    registerValueInterfaces(this,(string *)(&this->field_0x38 + (long)p_Var2));
  }
  return;
}

Assistant:

void ValueFederate::loadFederateData()
{
    vfManager = std::make_unique<ValueFederateManager>(coreObject.get(),
                                                       this,
                                                       getID(),
                                                       singleThreadFederate);
    vfManager->useJsonSerialization = useJsonSerialization;
    if (!configFile.empty()) {
        ValueFederate::registerValueInterfaces(configFile);
    }
}